

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::PricingSession::PricingSession(PricingSession *this,UserInfo *user_info)

{
  bool bVar1;
  PricingSubscriber *this_00;
  PixieProvider *this_01;
  allocator<char> local_49;
  string local_48;
  shared_ptr<spdlog::logger> local_28;
  UserInfo *local_18;
  UserInfo *user_info_local;
  PricingSession *this_local;
  
  local_18 = user_info;
  user_info_local = (UserInfo *)this;
  Subscriber::Subscriber(&this->super_Subscriber);
  Pricing::Pricing(&this->super_Pricing);
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_Subscribe_003a3400;
  (this->super_Pricing)._vptr_Pricing = (_func_int **)&PTR_SetPriceUpdateEventCallback_003a3468;
  std::
  vector<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
  ::vector(&this->provider_status_update_callback_);
  std::
  vector<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>_>_>
  ::vector(&this->price_update_callback_);
  std::
  vector<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
  ::vector(&this->subscription_status_callback_);
  std::
  map<bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
  ::map(&this->subscriptions_);
  bVar1 = std::operator==((shared_ptr<spdlog::logger> *)Log,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"PricingSession",&local_49);
    tools::LoggerFactory::GetLogger((LoggerFactory *)&local_28,&local_48);
    std::shared_ptr<spdlog::logger>::operator=((shared_ptr<spdlog::logger> *)Log,&local_28);
    std::shared_ptr<spdlog::logger>::~shared_ptr(&local_28);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  this->user_info_ = local_18;
  this_00 = (PricingSubscriber *)operator_new(0x20);
  PricingSubscriber::PricingSubscriber(this_00,this,local_18);
  this->pricing_subscriber_ = this_00;
  this_01 = (PixieProvider *)operator_new(0x300);
  pixie::PixieProvider::PixieProvider(this_01,local_18);
  this->pixie_provider_ = (Provider *)this_01;
  std::atomic<bool>::operator=(&this->running_,false);
  PrepareCallbacks(this);
  return;
}

Assistant:

PricingSession::PricingSession(UserInfo* user_info)
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("PricingSession");
    }

    user_info_ = user_info;
    pricing_subscriber_ = new PricingSubscriber(this, user_info);
    pixie_provider_ = new PixieProvider(user_info);
    running_ = ATOMIC_VAR_INIT(false);
    PrepareCallbacks();
}